

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionBody::CreateCacheIdToPropertyIdMap
          (FunctionBody *this,uint rootObjectLoadInlineCacheStart,
          uint rootObjectLoadMethodInlineCacheStart,uint rootObjectStoreInlineCacheStart,
          uint totalFieldAccessInlineCacheCount,uint isInstInlineCacheCount)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  
  uVar3 = GetRootObjectLoadInlineCacheStart(this);
  if (uVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x107f,"(this->GetRootObjectLoadInlineCacheStart() == 0)",
                                "this->GetRootObjectLoadInlineCacheStart() == 0");
    if (!bVar2) goto LAB_006cf532;
    *puVar4 = 0;
  }
  uVar3 = GetRootObjectLoadMethodInlineCacheStart(this);
  if (uVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1080,"(this->GetRootObjectLoadMethodInlineCacheStart() == 0)",
                                "this->GetRootObjectLoadMethodInlineCacheStart() == 0");
    if (!bVar2) goto LAB_006cf532;
    *puVar4 = 0;
  }
  uVar3 = GetRootObjectStoreInlineCacheStart(this);
  if (uVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1081,"(this->GetRootObjectStoreInlineCacheStart() == 0)",
                                "this->GetRootObjectStoreInlineCacheStart() == 0");
    if (!bVar2) goto LAB_006cf532;
    *puVar4 = 0;
  }
  uVar3 = GetInlineCacheCount(this);
  if (uVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1082,"(this->GetInlineCacheCount() == 0)",
                                "this->GetInlineCacheCount() == 0");
    if (!bVar2) goto LAB_006cf532;
    *puVar4 = 0;
  }
  uVar3 = GetIsInstInlineCacheCount(this);
  if (uVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1083,"(this->GetIsInstInlineCacheCount() == 0)",
                                "this->GetIsInstInlineCacheCount() == 0");
    if (!bVar2) {
LAB_006cf532:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  SetRootObjectLoadInlineCacheStart(this,rootObjectLoadInlineCacheStart);
  SetRootObjectLoadMethodInlineCacheStart(this,rootObjectLoadMethodInlineCacheStart);
  SetRootObjectStoreInlineCacheStart(this,rootObjectStoreInlineCacheStart);
  SetInlineCacheCount(this,totalFieldAccessInlineCacheCount);
  SetIsInstInlineCacheCount(this,isInstInlineCacheCount);
  CreateCacheIdToPropertyIdMap(this);
  return;
}

Assistant:

void FunctionBody::CreateCacheIdToPropertyIdMap(uint rootObjectLoadInlineCacheStart, uint rootObjectLoadMethodInlineCacheStart,
        uint rootObjectStoreInlineCacheStart,
        uint totalFieldAccessInlineCacheCount, uint isInstInlineCacheCount)
    {
        Assert(this->GetRootObjectLoadInlineCacheStart() == 0);
        Assert(this->GetRootObjectLoadMethodInlineCacheStart() == 0);
        Assert(this->GetRootObjectStoreInlineCacheStart() == 0);
        Assert(this->GetInlineCacheCount() == 0);
        Assert(this->GetIsInstInlineCacheCount() == 0);

        this->SetRootObjectLoadInlineCacheStart(rootObjectLoadInlineCacheStart);
        this->SetRootObjectLoadMethodInlineCacheStart(rootObjectLoadMethodInlineCacheStart);
        this->SetRootObjectStoreInlineCacheStart(rootObjectStoreInlineCacheStart);
        this->SetInlineCacheCount(totalFieldAccessInlineCacheCount);
        this->SetIsInstInlineCacheCount(isInstInlineCacheCount);

        this->CreateCacheIdToPropertyIdMap();
    }